

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O2

int __thiscall TextFile::open(TextFile *this,char *__file,int __oflag,...)

{
  path *this_00;
  bool bVar1;
  char cVar2;
  ulong in_RAX;
  ulong uVar3;
  ulong extraout_RAX;
  uintmax_t uVar4;
  Mode MVar5;
  Mode __fd;
  uchar numBuffer [3];
  ulong uStack_28;
  
  MVar5 = (Mode)__file;
  this_00 = &this->fileName;
  __fd = MVar5;
  uStack_28 = in_RAX;
  bVar1 = ghc::filesystem::path::empty(this_00);
  if (bVar1) {
    return 0;
  }
  bVar1 = isOpen(this);
  if (bVar1) {
    close(this,__fd);
  }
  uVar3 = 0;
  this->fromMemory = false;
  this->guessedEncoding = false;
  this->encoding = __oflag;
  this->mode = MVar5;
  if (MVar5 == Write) {
    ghc::filesystem::basic_fstream<char,_std::char_traits<char>_>::open
              (&this->stream,(char *)this_00,0x34);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      return 0;
    }
    uVar3 = std::__cxx11::string::resize((ulong)&this->buf);
    if (this->encoding != ASCII) {
      this->encoding = UTF8;
      bufPut(this,-0x11);
      bufPut(this,-0x45);
      bufPut(this,-0x41);
      uVar3 = extraout_RAX;
    }
  }
  else if (MVar5 == Read) {
    ghc::filesystem::basic_fstream<char,_std::char_traits<char>_>::open
              (&this->stream,(char *)this_00,0xc);
    uVar3 = std::__basic_file<char>::is_open();
    if ((char)uVar3 == '\0') {
      return 0;
    }
  }
  uStack_28 = uStack_28 & 0xff000000ffffffff;
  this->contentPos = 0;
  if (MVar5 != Read) {
    if (__oflag == 5) {
      this->encoding = UTF8;
      this->guessedEncoding = true;
    }
    goto LAB_0014826a;
  }
  uVar4 = ghc::filesystem::file_size(this_00);
  this->size_ = uVar4;
  std::istream::read((char *)this,(long)numBuffer);
  uVar3 = (ulong)(ushort)numBuffer._0_2_;
  if (numBuffer._0_2_ == -0x4411) {
    if (numBuffer[2] == 0xbf) {
      this->encoding = UTF8;
      this->contentPos = 3;
      goto LAB_0014826a;
    }
LAB_00148248:
    if (__oflag == 5) {
      this->encoding = UTF8;
      this->guessedEncoding = true;
    }
    uVar3 = std::istream::seekg(this,0,0);
  }
  else {
    if (numBuffer._0_2_ == -0x101) {
      this->encoding = UTF16LE;
    }
    else {
      if (numBuffer._0_2_ != -2) goto LAB_00148248;
      this->encoding = UTF16BE;
    }
    uVar3 = std::istream::seekg(this,2,0);
    this->contentPos = 2;
  }
LAB_0014826a:
  return (int)CONCAT71((int7)(uVar3 >> 8),1);
}

Assistant:

bool TextFile::open(Mode mode, Encoding defaultEncoding)
{
	if (fileName.empty())
		return false;

	if (isOpen())
		close();

	fromMemory = false;
	guessedEncoding = false;
	encoding = defaultEncoding;
	this->mode = mode;

	// open all files as binary due to unicode
	switch (mode)
	{
	case Read:
		stream.open(fileName, fs::fstream::in | fs::fstream::binary);

		if (!stream.is_open())
			return false;
		break;
	case Write:
		stream.open(fileName, fs::fstream::out | fs::fstream::binary | fs::fstream::trunc);

		if (!stream.is_open())
			return false;

		buf.resize(TEXTFILE_BUF_MAX_SIZE);
		if (encoding != ASCII)
		{
			encoding = UTF8;
			bufPut(char(0xEF));
			bufPut(char(0xBB));
			bufPut(char(0xBF));
		}
		break;
	}

	// detect encoding
	unsigned char numBuffer[3] = {0};
	contentPos = 0;

	if (mode == Read)
	{
		size_ = long(fs::file_size(fileName));

		stream.read(reinterpret_cast<char *>(numBuffer), 3);
		switch (numBuffer[0] | (numBuffer[1] << 8))
		{
		case 0xFFFE:
			encoding = UTF16BE;
			stream.seekg(2);
			contentPos = 2;
			break;
		case 0xFEFF:
			encoding = UTF16LE;
			stream.seekg(2);
			contentPos = 2;
			break;
		case 0xBBEF:
			if (numBuffer[2] == 0xBF)
			{
				encoding = UTF8;
				contentPos = 3;
				break;
			}
			[[fallthrough]];
		default:
			if (defaultEncoding == GUESS)
			{
				encoding = UTF8;
				guessedEncoding = true;
			}
			stream.seekg(0);
			break;
		}
	} else {
		if (defaultEncoding == GUESS)
		{
			encoding = UTF8;
			guessedEncoding = true;
		}
	}

	return true;
}